

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bencode.hpp
# Opt level: O0

int libtorrent::detail::write_integer<char*,long,void>(char **out,long data)

{
  const_iterator pcVar1;
  size_type sVar2;
  integer_type in_RCX;
  span<char> buf_00;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  char *local_50;
  undefined1 local_48 [8];
  string_view str;
  char buf [21];
  integer_type val;
  long data_local;
  char **out_local;
  
  span<char>::span<char,21l>((span<char> *)&__range2,(char (*) [21])&str.len_);
  buf_00.m_len = data;
  buf_00.m_ptr = local_50;
  _local_48 = integer_to_str((detail *)__range2,buf_00,in_RCX);
  __end2 = boost::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
  pcVar1 = boost::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
  for (; __end2 != pcVar1; __end2 = __end2 + 1) {
    **out = *__end2;
    *out = *out + 1;
  }
  sVar2 = boost::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
  return (int)sVar2;
}

Assistant:

int write_integer(OutIt& out, In data)
		{
			entry::integer_type const val = entry::integer_type(data);
			TORRENT_ASSERT(data == In(val));
			// the stack allocated buffer for keeping the
			// decimal representation of the number can
			// not hold number bigger than this:
			static_assert(sizeof(entry::integer_type) <= 8, "64 bit integers required");
			static_assert(sizeof(data) <= sizeof(entry::integer_type), "input data too big, see entry::integer_type");
			char buf[21];
			auto const str = integer_to_str(buf, val);
			for (char const c : str)
			{
				*out = c;
				++out;
			}
			return static_cast<int>(str.size());
		}